

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

int pbrt::TexelBytes(PixelFormat format)

{
  if (format < (Float|Half)) {
    return *(int *)(&DAT_0044bc18 + (ulong)format * 4);
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
           ,0x43,"Unhandled PixelFormat in TexelBytes()");
}

Assistant:

int TexelBytes(PixelFormat format) {
    switch (format) {
    case PixelFormat::U256:
        return 1;
    case PixelFormat::Half:
        return 2;
    case PixelFormat::Float:
        return 4;
    default:
        LOG_FATAL("Unhandled PixelFormat in TexelBytes()");
        return 0;
    }
}